

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O1

idx_t duckdb::StructMatchEquality<false,duckdb::NotDistinctFrom>
                (Vector *lhs_vector,TupleDataVectorFormat *lhs_format,SelectionVector *sel,
                idx_t count,TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *child_functions,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  data_ptr_t pdVar1;
  sel_t *psVar2;
  unsigned_long *puVar3;
  sel_t *psVar4;
  value_type vVar5;
  _Hash_node_base *p_Var6;
  const_reference pvVar7;
  pointer puVar8;
  __node_base_ptr p_Var9;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  reference this_00;
  type pVVar10;
  const_reference pvVar11;
  const_reference pvVar12;
  __node_base_ptr p_Var13;
  idx_t iVar14;
  idx_t iVar15;
  idx_t iVar16;
  idx_t iVar17;
  __hash_code __code;
  size_type __n;
  bool bVar18;
  LogicalType local_b0;
  Vector rhs_struct_row_locations;
  
  pdVar1 = rhs_row_locations->data;
  if (count == 0) {
    iVar14 = 0;
  }
  else {
    psVar2 = sel->sel_vector;
    puVar3 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
    ;
    psVar4 = ((lhs_format->unified).sel)->sel_vector;
    iVar14 = 0;
    iVar16 = 0;
    do {
      iVar15 = iVar16;
      if (psVar2 != (sel_t *)0x0) {
        iVar15 = (idx_t)psVar2[iVar16];
      }
      iVar17 = iVar15;
      if (psVar4 != (sel_t *)0x0) {
        iVar17 = (idx_t)psVar4[iVar15];
      }
      if (puVar3 == (unsigned_long *)0x0) {
        bVar18 = false;
      }
      else {
        bVar18 = (puVar3[iVar17 >> 6] >> (iVar17 & 0x3f) & 1) == 0;
      }
      if (bVar18 != ((1 << ((byte)col_idx & 7) &
                     (uint)*(byte *)(*(long *)(pdVar1 + iVar15 * 8) + (col_idx >> 3))) != 0)) {
        psVar2[iVar14] = (sel_t)iVar15;
        iVar14 = iVar14 + 1;
      }
      iVar16 = iVar16 + 1;
    } while (count != iVar16);
  }
  LogicalType::LogicalType(&local_b0,POINTER);
  Vector::Vector(&rhs_struct_row_locations,&local_b0,0x800);
  LogicalType::~LogicalType(&local_b0);
  pvVar7 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
  if (iVar14 != 0) {
    vVar5 = *pvVar7;
    iVar16 = 0;
    do {
      iVar15 = iVar16;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar15 = (idx_t)sel->sel_vector[iVar16];
      }
      *(value_type *)(rhs_struct_row_locations.data + iVar15 * 8) =
           *(long *)(pdVar1 + iVar15 * 8) + vVar5;
      iVar16 = iVar16 + 1;
    } while (iVar14 != iVar16);
  }
  puVar8 = unique_ptr<std::unordered_map<unsigned_long,_duckdb::TupleDataLayout,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>_>,_std::default_delete<std::unordered_map<unsigned_long,_duckdb::TupleDataLayout,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>_>_>,_true>
           ::operator->(&rhs_layout->struct_layouts);
  p_Var9 = (puVar8->_M_h)._M_buckets[col_idx % (puVar8->_M_h)._M_bucket_count];
  for (p_Var13 = p_Var9->_M_nxt; p_Var13[1]._M_nxt != (_Hash_node_base *)col_idx;
      p_Var13 = p_Var13->_M_nxt) {
    p_Var9 = p_Var13;
  }
  p_Var6 = p_Var9->_M_nxt;
  this = StructVector::GetEntries(lhs_vector);
  if (p_Var6[3]._M_nxt != p_Var6[2]._M_nxt) {
    __n = 0;
    do {
      this_00 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                ::operator[](this,__n);
      pVVar10 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          (this_00);
      pvVar11 = vector<duckdb::TupleDataVectorFormat,_true>::operator[](&lhs_format->children,__n);
      pvVar12 = vector<duckdb::MatchFunction,_true>::operator[](child_functions,__n);
      iVar14 = (*pvVar12->function)
                         (pVVar10,pvVar11,sel,iVar14,(TupleDataLayout *)(p_Var6 + 2),
                          &rhs_struct_row_locations,__n,&pvVar12->child_functions,no_match_sel,
                          no_match_count);
      __n = __n + 1;
    } while (__n < (ulong)(((long)p_Var6[3]._M_nxt - (long)p_Var6[2]._M_nxt >> 3) *
                          -0x5555555555555555));
  }
  if (rhs_struct_row_locations.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (rhs_struct_row_locations.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (rhs_struct_row_locations.buffer.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (rhs_struct_row_locations.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (rhs_struct_row_locations.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
      internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (rhs_struct_row_locations.validity.super_TemplatedValidityMask<unsigned_long>.
               validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&rhs_struct_row_locations.type);
  return iVar14;
}

Assistant:

static idx_t StructMatchEquality(Vector &lhs_vector, const TupleDataVectorFormat &lhs_format, SelectionVector &sel,
                                 const idx_t count, const TupleDataLayout &rhs_layout, Vector &rhs_row_locations,
                                 const idx_t col_idx, const vector<MatchFunction> &child_functions,
                                 SelectionVector *no_match_sel, idx_t &no_match_count) {
	using COMPARISON_OP = ComparisonOperationWrapper<OP>;

	// LHS
	const auto &lhs_sel = *lhs_format.unified.sel;
	const auto &lhs_validity = lhs_format.unified.validity;

	// RHS
	const auto rhs_locations = FlatVector::GetData<data_ptr_t>(rhs_row_locations);
	idx_t entry_idx;
	idx_t idx_in_entry;
	ValidityBytes::GetEntryIndex(col_idx, entry_idx, idx_in_entry);

	idx_t match_count = 0;
	for (idx_t i = 0; i < count; i++) {
		const auto idx = sel.get_index(i);

		const auto lhs_idx = lhs_sel.get_index(idx);
		const auto lhs_null = lhs_validity.AllValid() ? false : !lhs_validity.RowIsValid(lhs_idx);

		const auto &rhs_location = rhs_locations[idx];
		const ValidityBytes rhs_mask(rhs_location, rhs_layout.ColumnCount());
		const auto rhs_null = !rhs_mask.RowIsValid(rhs_mask.GetValidityEntryUnsafe(entry_idx), idx_in_entry);

		// For structs there is no value to compare, here we match NULLs and let recursion do the rest
		// So we use the comparison only if rhs or LHS is NULL and COMPARE_NULL is true
		if (!(lhs_null || rhs_null) ||
		    (COMPARISON_OP::COMPARE_NULL && COMPARISON_OP::template Operation<uint32_t>(0, 0, lhs_null, rhs_null))) {
			sel.set_index(match_count++, idx);
		} else if (NO_MATCH_SEL) {
			no_match_sel->set_index(no_match_count++, idx);
		}
	}

	// Create a Vector of pointers to the start of the TupleDataLayout of the STRUCT
	Vector rhs_struct_row_locations(LogicalType::POINTER);
	const auto rhs_offset_in_row = rhs_layout.GetOffsets()[col_idx];
	auto rhs_struct_locations = FlatVector::GetData<data_ptr_t>(rhs_struct_row_locations);
	for (idx_t i = 0; i < match_count; i++) {
		const auto idx = sel.get_index(i);
		rhs_struct_locations[idx] = rhs_locations[idx] + rhs_offset_in_row;
	}

	// Get the struct layout and struct entries
	const auto &rhs_struct_layout = rhs_layout.GetStructLayout(col_idx);
	auto &lhs_struct_vectors = StructVector::GetEntries(lhs_vector);
	D_ASSERT(rhs_struct_layout.ColumnCount() == lhs_struct_vectors.size());

	for (idx_t struct_col_idx = 0; struct_col_idx < rhs_struct_layout.ColumnCount(); struct_col_idx++) {
		auto &lhs_struct_vector = *lhs_struct_vectors[struct_col_idx];
		auto &lhs_struct_format = lhs_format.children[struct_col_idx];
		const auto &child_function = child_functions[struct_col_idx];
		match_count = child_function.function(lhs_struct_vector, lhs_struct_format, sel, match_count, rhs_struct_layout,
		                                      rhs_struct_row_locations, struct_col_idx, child_function.child_functions,
		                                      no_match_sel, no_match_count);
	}

	return match_count;
}